

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O0

Uint32 __thiscall Diligent::ShaderGLImpl::GetResourceCount(ShaderGLImpl *this)

{
  undefined *puVar1;
  bool bVar2;
  Char *Message;
  DeviceFeatures *pDVar3;
  element_type *this_00;
  undefined8 uVar4;
  Uint32 local_7c;
  undefined1 local_68 [8];
  string _msg;
  undefined1 local_38 [8];
  string msg;
  ShaderGLImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_Builder);
  if (bVar2) {
    FormatString<char[109]>
              ((string *)local_38,
               (char (*) [109])
               "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResourceCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x18b);
    std::__cxx11::string::~string((string *)local_38);
  }
  pDVar3 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetFeatures
                     (&((this->super_ShaderBase<Diligent::EngineGLImplTraits>).
                        super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                       .m_pDevice)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  if (pDVar3->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[87]>
              ((string *)local_68,
               (char (*) [87])
               "Shader resource queries are not available when separate shader objects are unsupported"
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar4,0);
    }
    std::__cxx11::string::~string((string *)local_68);
    this_local._4_4_ = 0;
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pShaderResources);
    if (bVar2) {
      this_00 = std::
                __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_pShaderResources);
      local_7c = ShaderResourcesGL::GetVariableCount(this_00);
    }
    else {
      local_7c = 0;
    }
    this_local._4_4_ = local_7c;
  }
  return this_local._4_4_;
}

Assistant:

Uint32 ShaderGLImpl::GetResourceCount() const
{
    DEV_CHECK_ERR(!m_Builder, "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");

    if (m_pDevice->GetFeatures().SeparablePrograms)
    {
        return m_pShaderResources ? m_pShaderResources->GetVariableCount() : 0;
    }
    else
    {
        LOG_WARNING_MESSAGE("Shader resource queries are not available when separate shader objects are unsupported");
        return 0;
    }
}